

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontFamily.cpp
# Opt level: O2

FontFaceHandleDefault * __thiscall
Rml::FontFamily::GetFaceHandle(FontFamily *this,FontStyle style,FontWeight weight,int size)

{
  pointer pFVar1;
  FontStyle FVar2;
  FontWeight FVar3;
  int iVar4;
  FontFaceHandleDefault *pFVar5;
  undefined6 in_register_00000012;
  long lVar6;
  FontFace *pFVar7;
  FontFace *this_00;
  int iVar8;
  size_t i;
  ulong uVar9;
  
  iVar8 = 0x7fffffff;
  lVar6 = 0;
  pFVar7 = (FontFace *)0x0;
  for (uVar9 = 0;
      pFVar1 = (this->font_faces).
               super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
               ._M_impl.super__Vector_impl_data._M_start, this_00 = pFVar7,
      uVar9 < (ulong)((long)(this->font_faces).
                            super__Vector_base<Rml::FontFamily::FontFaceEntry,_std::allocator<Rml::FontFamily::FontFaceEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar1 >> 4);
      uVar9 = uVar9 + 1) {
    this_00 = *(FontFace **)
               ((long)&(pFVar1->face)._M_t.
                       super___uniq_ptr_impl<Rml::FontFace,_std::default_delete<Rml::FontFace>_> +
               lVar6);
    FVar2 = FontFace::GetStyle(this_00);
    if (FVar2 == style) {
      FVar3 = FontFace::GetWeight(this_00);
      iVar4 = Math::Absolute((uint)FVar3 - (int)CONCAT62(in_register_00000012,weight));
      if (iVar4 < iVar8) {
        iVar8 = iVar4;
        pFVar7 = this_00;
      }
      if (iVar4 == 0) break;
    }
    lVar6 = lVar6 + 0x10;
  }
  if (this_00 != (FontFace *)0x0) {
    pFVar5 = FontFace::GetHandle(this_00,size,true);
    return pFVar5;
  }
  return (FontFaceHandleDefault *)0x0;
}

Assistant:

FontFaceHandleDefault* FontFamily::GetFaceHandle(Style::FontStyle style, Style::FontWeight weight, int size)
{
	int best_dist = INT_MAX;
	FontFace* matching_face = nullptr;
	for (size_t i = 0; i < font_faces.size(); i++)
	{
		FontFace* face = font_faces[i].face.get();

		if (face->GetStyle() == style)
		{
			const int dist = Math::Absolute((int)face->GetWeight() - (int)weight);
			if (dist == 0)
			{
				// Direct match for weight, break the loop early.
				matching_face = face;
				break;
			}
			else if (dist < best_dist)
			{
				// Best match so far for weight, store the face and dist.
				matching_face = face;
				best_dist = dist;
			}
		}
	}

	if (!matching_face)
		return nullptr;

	return matching_face->GetHandle(size, true);
}